

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

int __thiscall
CVmObjLookupTable::getp_make_list
          (CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,int store_keys)

{
  int iVar1;
  vm_val_t *this_00;
  _func_int_vm_val_t_ptr_vm_val_t_ptr *in_RCX;
  undefined8 in_RDX;
  vm_obj_id_t in_ESI;
  CVmNativeCodeDesc *in_RDI;
  uint *in_stack_ffffffffffffffc0;
  vm_val_t *in_stack_ffffffffffffffc8;
  int store_keys_00;
  undefined4 in_stack_ffffffffffffffe8;
  CVmNativeCodeDesc *this_01;
  
  store_keys_00 = (int)((ulong)in_RDX >> 0x20);
  this_01 = in_RDI;
  if ((getp_make_list(unsigned_int,vm_val_t*,unsigned_int*,int)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_make_list(unsigned_int,vm_val_t*,unsigned_int*,int)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_make_list::desc,0);
    __cxa_guard_release(&getp_make_list(unsigned_int,vm_val_t*,unsigned_int*,int)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_RDI)
  ;
  if (iVar1 == 0) {
    this_00 = CVmStack::push();
    vm_val_t::set_obj(this_00,in_ESI);
    make_list((CVmObjLookupTable *)this_01,(vm_val_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
              store_keys_00,in_RCX);
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::getp_make_list(VMG_ vm_obj_id_t self,
                                      vm_val_t *retval, uint *argc,
                                      int store_keys)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* push self while we're working, for gc protection */
    G_stk->push()->set_obj(self);

    /* make the list */
    make_list(vmg_ retval, store_keys, 0);
    
    /* discard our gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}